

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::ShowMetricsWindow(bool *p_open)

{
  ImGuiMetricsConfig *p_open_00;
  bool *pbVar1;
  int *piVar2;
  ImVector<unsigned_int> *pIVar3;
  ImVec2 IVar4;
  ImVec2 IVar5;
  int iVar6;
  ImGuiWindow *pIVar7;
  ImGuiWindow **ppIVar8;
  ImGuiViewportP *pIVar9;
  ImGuiPopupData *pIVar10;
  undefined8 *puVar11;
  ImFontAtlas *atlas;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  ImGuiContext *pIVar15;
  ImGuiContext *pIVar16;
  bool bVar17;
  ImGuiContext *g;
  ImDrawList *pIVar18;
  ImGuiWindow **ppIVar19;
  ImGuiWindow **__dest;
  int iVar20;
  ImU32 col;
  ImGuiContext *g_8;
  long lVar21;
  char *pcVar22;
  long lVar23;
  char *pcVar24;
  int rect_n;
  ImGuiTable *pIVar25;
  ImGuiTableSettings *settings;
  int iVar26;
  undefined **ppuVar27;
  size_t __nmemb;
  char **ppcVar28;
  undefined1 auVar29 [8];
  long lVar30;
  int rect_n_1;
  ulong uVar31;
  ImVector<ImDrawList_*> *pIVar32;
  uint uVar33;
  ImGuiContext *g_6;
  ulong uVar34;
  ImGuiTabBar *pIVar35;
  uint *puVar36;
  byte bVar37;
  float fVar38;
  float fVar39;
  float extraout_XMM0_Db;
  float fVar40;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 uVar41;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 uVar42;
  undefined4 uVar43;
  undefined4 uVar44;
  undefined4 uVar45;
  undefined4 uVar46;
  undefined4 uVar47;
  undefined4 uVar48;
  float fVar49;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  ImRect IVar52;
  ImVec2 local_1b8;
  int *local_1b0;
  undefined1 local_1a8 [16];
  int *local_198;
  ImVec2 local_190;
  undefined1 local_188 [8];
  float fStack_180;
  float fStack_17c;
  undefined1 local_178 [8];
  float fStack_170;
  float fStack_16c;
  undefined1 local_168 [16];
  char buf [128];
  char *wrt_rects_names [8];
  char *trt_rects_names [13];
  
  pIVar15 = GImGui;
  bVar37 = 0;
  p_open_00 = &GImGui->DebugMetricsConfig;
  if ((GImGui->DebugMetricsConfig).ShowStackTool == true) {
    ShowStackToolWindow(&p_open_00->ShowStackTool);
  }
  bVar17 = Begin("Dear ImGui Metrics/Debugger",p_open,0);
  if ((bVar17) &&
     (pIVar7 = GImGui->CurrentWindow, pIVar7->WriteAccessed = true, pIVar7->BeginCount < 2)) {
    Text("Dear ImGui %s","1.88 WIP");
    uVar45 = 0;
    uVar47 = 0;
    Text("Application average %.3f ms/frame (%.1f FPS)",
         SUB84((double)(1000.0 / (pIVar15->IO).Framerate),0));
    iVar26 = (pIVar15->IO).MetricsRenderIndices;
    Text("%d vertices, %d indices (%d triangles)",(ulong)(uint)(pIVar15->IO).MetricsRenderVertices,
         (long)iVar26,(ulong)(uint)(iVar26 / 3));
    Text("%d visible windows, %d active allocations",(ulong)(uint)(pIVar15->IO).MetricsRenderWindows
         ,(ulong)(uint)(pIVar15->IO).MetricsActiveAllocations);
    Separator();
    wrt_rects_names[6] = "ContentIdeal";
    wrt_rects_names[7] = "ContentRegionRect";
    wrt_rects_names[4] = "WorkRect";
    wrt_rects_names[5] = "Content";
    wrt_rects_names[2] = "InnerRect";
    wrt_rects_names[3] = "InnerClipRect";
    wrt_rects_names[0] = "OuterRect";
    wrt_rects_names[1] = "OuterRectClipped";
    ppuVar27 = &PTR_anon_var_dwarf_2c3bc_001a82a0;
    ppcVar28 = trt_rects_names;
    for (lVar21 = 0xd; lVar21 != 0; lVar21 = lVar21 + -1) {
      *ppcVar28 = *ppuVar27;
      ppuVar27 = ppuVar27 + (ulong)bVar37 * -2 + 1;
      ppcVar28 = ppcVar28 + (ulong)bVar37 * -2 + 1;
    }
    local_198 = &(pIVar15->DebugMetricsConfig).ShowWindowsRectsType;
    if ((pIVar15->DebugMetricsConfig).ShowWindowsRectsType < 0) {
      *local_198 = 4;
    }
    local_1b0 = &(pIVar15->DebugMetricsConfig).ShowTablesRectsType;
    if ((pIVar15->DebugMetricsConfig).ShowTablesRectsType < 0) {
      *local_1b0 = 2;
    }
    bVar17 = TreeNode("Tools");
    if (bVar17) {
      Checkbox("Show stack tool",&p_open_00->ShowStackTool);
      pIVar16 = GImGui;
      pIVar7 = GImGui->CurrentWindow;
      pIVar7->WriteAccessed = true;
      if (pIVar7->SkipItems == false) {
        (pIVar7->DC).CursorPos.x = (pIVar16->Style).ItemSpacing.x + (pIVar7->DC).CursorPosPrevLine.x
        ;
        (pIVar7->DC).CursorPos.y = (pIVar7->DC).CursorPosPrevLine.y;
        (pIVar7->DC).CurrLineSize = (pIVar7->DC).PrevLineSize;
        (pIVar7->DC).CurrLineTextBaseOffset = (pIVar7->DC).PrevLineTextBaseOffset;
      }
      MetricsHelpMarker("You can also call ImGui::ShowStackToolWindow() from your code.");
      Checkbox("Show windows begin order",&(pIVar15->DebugMetricsConfig).ShowWindowsBeginOrder);
      pbVar1 = &(pIVar15->DebugMetricsConfig).ShowWindowsRects;
      Checkbox("Show windows rectangles",pbVar1);
      pIVar16 = GImGui;
      pIVar7 = GImGui->CurrentWindow;
      pIVar7->WriteAccessed = true;
      if (pIVar7->SkipItems == false) {
        (pIVar7->DC).CursorPos.x = (pIVar16->Style).ItemSpacing.x + (pIVar7->DC).CursorPosPrevLine.x
        ;
        (pIVar7->DC).CursorPos.y = (pIVar7->DC).CursorPosPrevLine.y;
        (pIVar7->DC).CurrLineSize = (pIVar7->DC).PrevLineSize;
        (pIVar7->DC).CurrLineTextBaseOffset = (pIVar7->DC).PrevLineTextBaseOffset;
      }
      fVar38 = pIVar16->FontSize;
      *(byte *)&(pIVar16->NextItemData).Flags = (byte)(pIVar16->NextItemData).Flags | 1;
      (pIVar16->NextItemData).Width = fVar38 * 12.0;
      bVar17 = Combo("##show_windows_rect_type",local_198,wrt_rects_names,8,8);
      *pbVar1 = (bool)(*pbVar1 | bVar17);
      if ((*pbVar1 != false) && (pIVar15->NavWindow != (ImGuiWindow *)0x0)) {
        lVar21 = 0;
        BulletText("\'%s\':",pIVar15->NavWindow->Name);
        pIVar16 = GImGui;
        pIVar7 = GImGui->CurrentWindow;
        pIVar7->WriteAccessed = true;
        fVar38 = (pIVar16->Style).IndentSpacing + (pIVar7->DC).Indent.x;
        (pIVar7->DC).Indent.x = fVar38;
        (pIVar7->DC).CursorPos.x = fVar38 + (pIVar7->Pos).x + (pIVar7->DC).ColumnsOffset.x;
        do {
          IVar52 = ShowMetricsWindow::Funcs::GetWindowRect(pIVar15->NavWindow,(int)lVar21);
          uVar45 = 0;
          uVar47 = 0;
          Text("(%6.1f,%6.1f) (%6.1f,%6.1f) Size (%6.1f,%6.1f) %s",SUB84((double)IVar52.Min.x,0),
               SUB84((double)IVar52.Min.y,0),SUB84((double)IVar52.Max.x,0),(double)IVar52.Max.y,
               (double)(IVar52.Max.x - IVar52.Min.x),(double)(IVar52.Max.y - IVar52.Min.y),
               wrt_rects_names[lVar21]);
          pIVar16 = GImGui;
          lVar21 = lVar21 + 1;
        } while (lVar21 != 8);
        pIVar7 = GImGui->CurrentWindow;
        pIVar7->WriteAccessed = true;
        fVar38 = (pIVar7->DC).Indent.x - (pIVar16->Style).IndentSpacing;
        (pIVar7->DC).Indent.x = fVar38;
        (pIVar7->DC).CursorPos.x = fVar38 + (pIVar7->Pos).x + (pIVar7->DC).ColumnsOffset.x;
      }
      pbVar1 = &(pIVar15->DebugMetricsConfig).ShowTablesRects;
      Checkbox("Show tables rectangles",pbVar1);
      pIVar16 = GImGui;
      pIVar7 = GImGui->CurrentWindow;
      pIVar7->WriteAccessed = true;
      if (pIVar7->SkipItems == false) {
        (pIVar7->DC).CursorPos.x = (pIVar16->Style).ItemSpacing.x + (pIVar7->DC).CursorPosPrevLine.x
        ;
        (pIVar7->DC).CursorPos.y = (pIVar7->DC).CursorPosPrevLine.y;
        (pIVar7->DC).CurrLineSize = (pIVar7->DC).PrevLineSize;
        (pIVar7->DC).CurrLineTextBaseOffset = (pIVar7->DC).PrevLineTextBaseOffset;
      }
      fVar38 = pIVar16->FontSize;
      *(byte *)&(pIVar16->NextItemData).Flags = (byte)(pIVar16->NextItemData).Flags | 1;
      (pIVar16->NextItemData).Width = fVar38 * 12.0;
      bVar17 = Combo("##show_table_rects_type",local_1b0,trt_rects_names,0xd,0xd);
      *pbVar1 = (bool)(*pbVar1 | bVar17);
      if (((*pbVar1 != false) && (pIVar15->NavWindow != (ImGuiWindow *)0x0)) &&
         (0 < (pIVar15->Tables).Map.Data.Size)) {
        auVar29 = (undefined1  [8])0x0;
        do {
          pIVar25 = (pIVar15->Tables).Buf.Data;
          lVar21 = (long)(pIVar15->Tables).Map.Data.Data[(long)auVar29].field_1.val_i;
          if ((pIVar25 != (ImGuiTable *)0x0 && lVar21 != -1) &&
             (pIVar25 = pIVar25 + lVar21, pIVar15->FrameCount + -1 <= pIVar25->LastFrameActive)) {
            if ((pIVar25->OuterWindow == pIVar15->NavWindow) ||
               (pIVar25->InnerWindow == pIVar15->NavWindow)) {
              local_178 = auVar29;
              BulletText("Table 0x%08X (%d columns, in \'%s\')",(ulong)pIVar25->ID,
                         (ulong)(uint)pIVar25->ColumnsCount,pIVar25->OuterWindow->Name);
              bVar17 = IsItemHovered(0);
              if (bVar17) {
                pIVar18 = GetViewportDrawList(*(GImGui->Viewports).Data,1,"##Foreground");
                auVar14 = buf._0_16_;
                IVar4 = (pIVar25->OuterRect).Min;
                buf._4_4_ = IVar4.y + -1.0;
                buf._0_4_ = IVar4.x + -1.0;
                buf._8_8_ = auVar14._8_8_;
                IVar4 = (pIVar25->OuterRect).Max;
                local_1b8.y = IVar4.y + 1.0;
                local_1b8.x = IVar4.x + 1.0;
                uVar45 = 0;
                uVar47 = 0;
                ImDrawList::AddRect(pIVar18,(ImVec2 *)buf,&local_1b8,0xff00ffff,0.0,0,2.0);
              }
              pIVar16 = GImGui;
              pIVar7 = GImGui->CurrentWindow;
              pIVar7->WriteAccessed = true;
              fVar38 = (pIVar16->Style).IndentSpacing + (pIVar7->DC).Indent.x;
              (pIVar7->DC).Indent.x = fVar38;
              (pIVar7->DC).CursorPos.x = fVar38 + (pIVar7->Pos).x + (pIVar7->DC).ColumnsOffset.x;
              uVar31 = 0;
              do {
                iVar26 = (int)uVar31;
                if (uVar31 < 6) {
                  IVar52 = ShowMetricsWindow::Funcs::GetTableRect(pIVar25,iVar26,-1);
                  local_1a8._0_8_ = IVar52.Max;
                  local_1a8._8_4_ = uVar45;
                  local_1a8._12_4_ = uVar47;
                  uVar45 = 0;
                  uVar47 = 0;
                  fStack_180 = (float)extraout_XMM0_Dc_00;
                  local_188._0_4_ = IVar52.Min.x;
                  local_188._4_4_ = IVar52.Min.y;
                  fStack_17c = (float)extraout_XMM0_Dd_00;
                  ImFormatString(buf,0x80,"(%6.1f,%6.1f) (%6.1f,%6.1f) Size (%6.1f,%6.1f) %s",
                                 SUB84((double)IVar52.Min.x,0),SUB84((double)IVar52.Min.y,0),
                                 SUB84((double)IVar52.Max.x,0),(double)IVar52.Max.y,
                                 (double)(IVar52.Max.x - IVar52.Min.x),
                                 (double)(IVar52.Max.y - IVar52.Min.y),trt_rects_names[uVar31]);
                  local_1b8.x = 0.0;
                  local_1b8.y = 0.0;
                  Selectable(buf,false,0,&local_1b8);
                  bVar17 = IsItemHovered(0);
                  if (bVar17) {
                    pIVar18 = GetViewportDrawList(*(GImGui->Viewports).Data,1,"##Foreground");
                    local_1b8.y = (float)local_188._4_4_ + -1.0;
                    local_1b8.x = (float)local_188._0_4_ + -1.0;
                    local_190.y = (float)local_1a8._4_4_ + 1.0;
                    local_190.x = (float)local_1a8._0_4_ + 1.0;
                    uVar45 = 0;
                    uVar47 = 0;
                    ImDrawList::AddRect(pIVar18,&local_1b8,&local_190,0xff00ffff,0.0,0,2.0);
                  }
                }
                else if (((iVar26 == 8) || (iVar26 == 6)) && (0 < pIVar25->ColumnsCount)) {
                  uVar34 = 0;
                  do {
                    IVar52 = ShowMetricsWindow::Funcs::GetTableRect(pIVar25,iVar26,(int)uVar34);
                    local_1a8._0_8_ = IVar52.Max;
                    local_1a8._8_4_ = uVar45;
                    local_1a8._12_4_ = uVar47;
                    uVar45 = 0;
                    uVar47 = 0;
                    fStack_180 = (float)extraout_XMM0_Dc;
                    local_188._0_4_ = IVar52.Min.x;
                    local_188._4_4_ = IVar52.Min.y;
                    fStack_17c = (float)extraout_XMM0_Dd;
                    ImFormatString(buf,0x80,
                                   "(%6.1f,%6.1f) (%6.1f,%6.1f) Size (%6.1f,%6.1f) Col %d %s",
                                   SUB84((double)IVar52.Min.x,0),SUB84((double)IVar52.Min.y,0),
                                   SUB84((double)IVar52.Max.x,0),(double)IVar52.Max.y,
                                   (double)(IVar52.Max.x - IVar52.Min.x),
                                   (double)(IVar52.Max.y - IVar52.Min.y),uVar34);
                    local_1b8.x = 0.0;
                    local_1b8.y = 0.0;
                    Selectable(buf,false,0,&local_1b8);
                    bVar17 = IsItemHovered(0);
                    if (bVar17) {
                      pIVar18 = GetViewportDrawList(*(GImGui->Viewports).Data,1,"##Foreground");
                      local_1b8.y = (float)local_188._4_4_ + -1.0;
                      local_1b8.x = (float)local_188._0_4_ + -1.0;
                      local_190.y = (float)local_1a8._4_4_ + 1.0;
                      local_190.x = (float)local_1a8._0_4_ + 1.0;
                      uVar45 = 0;
                      uVar47 = 0;
                      ImDrawList::AddRect(pIVar18,&local_1b8,&local_190,0xff00ffff,0.0,0,2.0);
                    }
                    uVar33 = (int)uVar34 + 1;
                    uVar34 = (ulong)uVar33;
                  } while ((int)uVar33 < pIVar25->ColumnsCount);
                }
                pIVar16 = GImGui;
                uVar31 = uVar31 + 1;
              } while (uVar31 != 0xd);
              pIVar7 = GImGui->CurrentWindow;
              pIVar7->WriteAccessed = true;
              fVar38 = (pIVar7->DC).Indent.x - (pIVar16->Style).IndentSpacing;
              (pIVar7->DC).Indent.x = fVar38;
              (pIVar7->DC).CursorPos.x = fVar38 + (pIVar7->Pos).x + (pIVar7->DC).ColumnsOffset.x;
              auVar29 = local_178;
            }
          }
          auVar29 = (undefined1  [8])((long)auVar29 + 1);
        } while ((long)auVar29 < (long)(pIVar15->Tables).Map.Data.Size);
      }
      auVar14._8_8_ = 0;
      auVar14[0] = buf[8];
      auVar14[1] = buf[9];
      auVar14[2] = buf[10];
      auVar14[3] = buf[0xb];
      auVar14[4] = buf[0xc];
      auVar14[5] = buf[0xd];
      auVar14[6] = buf[0xe];
      auVar14[7] = buf[0xf];
      buf._0_16_ = auVar14 << 0x40;
      bVar17 = Button("Item Picker..",(ImVec2 *)buf);
      if (bVar17) {
        GImGui->DebugItemPickerActive = true;
      }
      pIVar16 = GImGui;
      pIVar7 = GImGui->CurrentWindow;
      pIVar7->WriteAccessed = true;
      if (pIVar7->SkipItems == false) {
        (pIVar7->DC).CursorPos.x = (pIVar16->Style).ItemSpacing.x + (pIVar7->DC).CursorPosPrevLine.x
        ;
        (pIVar7->DC).CursorPos.y = (pIVar7->DC).CursorPosPrevLine.y;
        (pIVar7->DC).CurrLineSize = (pIVar7->DC).PrevLineSize;
        (pIVar7->DC).CurrLineTextBaseOffset = (pIVar7->DC).PrevLineTextBaseOffset;
      }
      MetricsHelpMarker(
                       "Will call the IM_DEBUG_BREAK() macro to break in debugger.\nWarning: If you don\'t have a debugger attached, this will probably crash."
                       );
      TreePop();
    }
    local_1a8._0_8_ = &pIVar15->Windows;
    uVar31 = 0;
    bVar17 = TreeNode("Windows","Windows (%d)",(ulong)(uint)(pIVar15->Windows).Size);
    if (bVar17) {
      DebugNodeWindowsList((ImVector<ImGuiWindow_*> *)local_1a8._0_8_,"By display order");
      DebugNodeWindowsList(&pIVar15->WindowsFocusOrder,"By focus order (root windows)");
      bVar17 = TreeNode("By submission order (begin stack)");
      if (bVar17) {
        iVar26 = (pIVar15->WindowsTempSortBuffer).Capacity;
        if (iVar26 < 0) {
          uVar33 = iVar26 / 2 + iVar26;
          uVar34 = 0;
          if (0 < (int)uVar33) {
            uVar34 = (ulong)uVar33;
          }
          if (GImGui != (ImGuiContext *)0x0) {
            piVar2 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar2 = *piVar2 + 1;
          }
          ppIVar19 = (ImGuiWindow **)(*GImAllocatorAllocFunc)(uVar34 * 8,GImAllocatorUserData);
          ppIVar8 = (pIVar15->WindowsTempSortBuffer).Data;
          if (ppIVar8 != (ImGuiWindow **)0x0) {
            memcpy(ppIVar19,ppIVar8,(long)(pIVar15->WindowsTempSortBuffer).Size << 3);
            ppIVar8 = (pIVar15->WindowsTempSortBuffer).Data;
            if ((ppIVar8 != (ImGuiWindow **)0x0) && (GImGui != (ImGuiContext *)0x0)) {
              piVar2 = &(GImGui->IO).MetricsActiveAllocations;
              *piVar2 = *piVar2 + -1;
            }
            (*GImAllocatorFreeFunc)(ppIVar8,GImAllocatorUserData);
          }
          (pIVar15->WindowsTempSortBuffer).Data = ppIVar19;
          (pIVar15->WindowsTempSortBuffer).Capacity = (int)uVar34;
        }
        (pIVar15->WindowsTempSortBuffer).Size = 0;
        if (0 < (pIVar15->Windows).Size) {
          lVar21 = 0;
          do {
            ppIVar8 = (pIVar15->Windows).Data;
            if (pIVar15->FrameCount <= ppIVar8[lVar21]->LastFrameActive + 1) {
              iVar26 = (pIVar15->WindowsTempSortBuffer).Size;
              iVar6 = (pIVar15->WindowsTempSortBuffer).Capacity;
              if (iVar26 == iVar6) {
                if (iVar6 == 0) {
                  iVar20 = 8;
                }
                else {
                  iVar20 = iVar6 / 2 + iVar6;
                }
                iVar26 = iVar26 + 1;
                if (iVar26 < iVar20) {
                  iVar26 = iVar20;
                }
                if (iVar6 < iVar26) {
                  if (GImGui != (ImGuiContext *)0x0) {
                    piVar2 = &(GImGui->IO).MetricsActiveAllocations;
                    *piVar2 = *piVar2 + 1;
                  }
                  __dest = (ImGuiWindow **)
                           (*GImAllocatorAllocFunc)((long)iVar26 << 3,GImAllocatorUserData);
                  ppIVar19 = (pIVar15->WindowsTempSortBuffer).Data;
                  if (ppIVar19 != (ImGuiWindow **)0x0) {
                    memcpy(__dest,ppIVar19,(long)(pIVar15->WindowsTempSortBuffer).Size << 3);
                    ppIVar19 = (pIVar15->WindowsTempSortBuffer).Data;
                    if ((ppIVar19 != (ImGuiWindow **)0x0) && (GImGui != (ImGuiContext *)0x0)) {
                      piVar2 = &(GImGui->IO).MetricsActiveAllocations;
                      *piVar2 = *piVar2 + -1;
                    }
                    (*GImAllocatorFreeFunc)(ppIVar19,GImAllocatorUserData);
                  }
                  (pIVar15->WindowsTempSortBuffer).Data = __dest;
                  (pIVar15->WindowsTempSortBuffer).Capacity = iVar26;
                }
              }
              (pIVar15->WindowsTempSortBuffer).Data[(pIVar15->WindowsTempSortBuffer).Size] =
                   ppIVar8[lVar21];
              (pIVar15->WindowsTempSortBuffer).Size = (pIVar15->WindowsTempSortBuffer).Size + 1;
            }
            lVar21 = lVar21 + 1;
          } while (lVar21 < *(int *)local_1a8._0_8_);
        }
        __nmemb = (size_t)(pIVar15->WindowsTempSortBuffer).Size;
        if (1 < __nmemb) {
          qsort((pIVar15->WindowsTempSortBuffer).Data,__nmemb,8,
                ShowMetricsWindow::Func::WindowComparerByBeginOrder);
        }
        DebugNodeWindowsListByBeginStackParent
                  ((pIVar15->WindowsTempSortBuffer).Data,(pIVar15->WindowsTempSortBuffer).Size,
                   (ImGuiWindow *)0x0);
        TreePop();
      }
      TreePop();
    }
    lVar21 = (long)(pIVar15->Viewports).Size;
    if (0 < lVar21) {
      lVar23 = 0;
      uVar31 = 0;
      do {
        lVar30 = 0;
        iVar26 = 0;
        do {
          iVar26 = iVar26 + *(int *)((long)&((pIVar15->Viewports).Data[lVar23]->DrawDataBuilder).
                                            Layers[0].Size + lVar30);
          lVar30 = lVar30 + 0x10;
        } while (lVar30 == 0x10);
        uVar31 = (ulong)(uint)((int)uVar31 + iVar26);
        lVar23 = lVar23 + 1;
      } while (lVar23 != lVar21);
    }
    bVar17 = TreeNode("DrawLists","DrawLists (%d)",uVar31);
    if (bVar17) {
      Checkbox("Show ImDrawCmd mesh when hovering",&(pIVar15->DebugMetricsConfig).ShowDrawCmdMesh);
      Checkbox("Show ImDrawCmd bounding boxes when hovering",
               &(pIVar15->DebugMetricsConfig).ShowDrawCmdBoundingBoxes);
      if (0 < (pIVar15->Viewports).Size) {
        lVar21 = 0;
        do {
          pIVar9 = (pIVar15->Viewports).Data[lVar21];
          lVar23 = 0;
          do {
            if (0 < (pIVar9->DrawDataBuilder).Layers[lVar23].Size) {
              pIVar32 = (pIVar9->DrawDataBuilder).Layers + lVar23;
              lVar30 = 0;
              do {
                DebugNodeDrawList((ImGuiWindow *)0x0,pIVar32->Data[lVar30],"DrawList");
                lVar30 = lVar30 + 1;
              } while (lVar30 < pIVar32->Size);
            }
            bVar17 = lVar23 == 0;
            lVar23 = lVar23 + 1;
          } while (bVar17);
          lVar21 = lVar21 + 1;
        } while (lVar21 < (pIVar15->Viewports).Size);
      }
      TreePop();
    }
    bVar17 = TreeNode("Viewports","Viewports (%d)",(ulong)(uint)(pIVar15->Viewports).Size);
    if (bVar17) {
      fVar38 = GetTreeNodeToLabelSpacing();
      pIVar16 = GImGui;
      pIVar7 = GImGui->CurrentWindow;
      pIVar7->WriteAccessed = true;
      fVar49 = extraout_XMM0_Db;
      if ((fVar38 == 0.0) && (!NAN(fVar38))) {
        fVar38 = (pIVar16->Style).IndentSpacing;
        fVar49 = 0.0;
      }
      fVar38 = fVar38 + (pIVar7->DC).Indent.x;
      (pIVar7->DC).Indent.x = fVar38;
      fVar38 = fVar38 + (pIVar7->Pos).x + (pIVar7->DC).ColumnsOffset.x;
      (pIVar7->DC).CursorPos.x = fVar38;
      iVar26 = (pIVar16->Viewports).Size;
      local_168 = _DAT_0017b420;
      _local_178 = _DAT_0017b390;
      if (0 < (long)iVar26) {
        uVar45 = 0x7f7fffff;
        uVar47 = 0x7f7fffff;
        uVar41 = 0;
        uVar42 = 0;
        uVar43 = 0xff7fffff;
        uVar44 = 0xff7fffff;
        uVar46 = 0;
        uVar48 = 0;
        lVar21 = 0;
        do {
          pIVar9 = (pIVar16->Viewports).Data[lVar21];
          IVar4 = (pIVar9->super_ImGuiViewport).Pos;
          auVar51._8_8_ = 0;
          auVar51._0_4_ = IVar4.x;
          auVar51._4_4_ = IVar4.y;
          IVar5 = (pIVar9->super_ImGuiViewport).Size;
          auVar50._0_4_ = IVar5.x + IVar4.x;
          auVar50._4_4_ = IVar5.y + IVar4.y;
          auVar50._8_8_ = 0;
          auVar13._4_4_ = uVar44;
          auVar13._0_4_ = uVar43;
          auVar13._8_4_ = uVar46;
          auVar13._12_4_ = uVar48;
          local_168 = maxps(auVar50,auVar13);
          auVar12._4_4_ = uVar47;
          auVar12._0_4_ = uVar45;
          auVar12._8_4_ = uVar41;
          auVar12._12_4_ = uVar42;
          _local_178 = minps(auVar51,auVar12);
          lVar21 = lVar21 + 1;
          uVar43 = local_168._0_4_;
          uVar44 = local_168._4_4_;
          uVar46 = local_168._8_4_;
          uVar48 = local_168._12_4_;
          uVar45 = local_178._0_4_;
          uVar47 = local_178._4_4_;
          uVar41 = local_178._8_4_;
          uVar42 = local_178._12_4_;
        } while (iVar26 != lVar21);
      }
      if (0 < iVar26) {
        local_188._0_4_ = fVar38 + (float)local_178._0_4_ * -0.125;
        local_188._4_4_ = (pIVar7->DC).CursorPos.y + (float)local_178._4_4_ * -0.125;
        lVar21 = 0;
        fStack_180 = fVar49 + fStack_170 * 0.0;
        fStack_17c = fStack_16c * 0.0 + 0.0;
        fVar38 = (float)local_188._0_4_;
        fVar49 = (float)local_188._4_4_;
        do {
          pIVar9 = (pIVar16->Viewports).Data[lVar21];
          IVar4 = (pIVar9->super_ImGuiViewport).Pos;
          fVar39 = IVar4.x;
          fVar40 = IVar4.y;
          IVar4 = (pIVar9->super_ImGuiViewport).Size;
          buf._4_4_ = fVar40 * 0.125 + fVar49;
          buf._0_4_ = fVar39 * 0.125 + fVar38;
          buf._8_4_ = (IVar4.x + fVar39) * 0.125 + fVar38;
          buf._12_4_ = (IVar4.y + fVar40) * 0.125 + fVar49;
          DebugRenderViewportThumbnail(pIVar7->DrawList,pIVar9,(ImRect *)buf);
          lVar21 = lVar21 + 1;
          fVar38 = (float)local_188._0_4_;
          fVar49 = (float)local_188._4_4_;
        } while (lVar21 < (pIVar16->Viewports).Size);
      }
      buf._4_4_ = ((float)local_168._4_4_ - (float)local_178._4_4_) * 0.125;
      buf._0_4_ = ((float)local_168._0_4_ - (float)local_178._0_4_) * 0.125;
      Dummy((ImVec2 *)buf);
      fVar38 = GetTreeNodeToLabelSpacing();
      pIVar16 = GImGui;
      pIVar7 = GImGui->CurrentWindow;
      pIVar7->WriteAccessed = true;
      if ((fVar38 == 0.0) && (!NAN(fVar38))) {
        fVar38 = (pIVar16->Style).IndentSpacing;
      }
      fVar38 = (pIVar7->DC).Indent.x - fVar38;
      (pIVar7->DC).Indent.x = fVar38;
      (pIVar7->DC).CursorPos.x = fVar38 + (pIVar7->Pos).x + (pIVar7->DC).ColumnsOffset.x;
      if (0 < (pIVar15->Viewports).Size) {
        lVar21 = 0;
        do {
          DebugNodeViewport((pIVar15->Viewports).Data[lVar21]);
          lVar21 = lVar21 + 1;
        } while (lVar21 < (pIVar15->Viewports).Size);
      }
      TreePop();
    }
    bVar17 = TreeNode("Popups","Popups (%d)",(ulong)(uint)(pIVar15->OpenPopupStack).Size);
    if (bVar17) {
      if (0 < (pIVar15->OpenPopupStack).Size) {
        lVar23 = 8;
        lVar21 = 0;
        do {
          pIVar10 = (pIVar15->OpenPopupStack).Data;
          puVar11 = *(undefined8 **)((long)&pIVar10->PopupId + lVar23);
          pcVar24 = "NULL";
          if (puVar11 != (undefined8 *)0x0) {
            pcVar24 = (char *)*puVar11;
          }
          pcVar22 = "";
          if ((puVar11 != (undefined8 *)0x0) &&
             (pcVar22 = " ChildWindow", (*(byte *)((long)puVar11 + 0xf) & 1) == 0)) {
            pcVar22 = "";
          }
          BulletText("PopupID: %08x, Window: \'%s\'%s%s",
                     (ulong)*(uint *)((long)pIVar10 + lVar23 + -8),pcVar24,pcVar22);
          lVar21 = lVar21 + 1;
          lVar23 = lVar23 + 0x30;
        } while (lVar21 < (pIVar15->OpenPopupStack).Size);
      }
      TreePop();
    }
    bVar17 = TreeNode("TabBars","Tab Bars (%d)",(ulong)(uint)(pIVar15->TabBars).AliveCount);
    if (bVar17) {
      if (0 < (pIVar15->TabBars).Map.Data.Size) {
        lVar23 = 8;
        lVar21 = 0;
        do {
          pIVar35 = (pIVar15->TabBars).Buf.Data;
          lVar30 = (long)*(int *)((long)&((pIVar15->TabBars).Map.Data.Data)->key + lVar23);
          if (pIVar35 != (ImGuiTabBar *)0x0 && lVar30 != -1) {
            pIVar35 = pIVar35 + lVar30;
            PushID(pIVar35);
            DebugNodeTabBar(pIVar35,"TabBar");
            pIVar3 = &GImGui->CurrentWindow->IDStack;
            pIVar3->Size = pIVar3->Size + -1;
          }
          lVar21 = lVar21 + 1;
          lVar23 = lVar23 + 0x10;
        } while (lVar21 < (pIVar15->TabBars).Map.Data.Size);
      }
      TreePop();
    }
    bVar17 = TreeNode("Tables","Tables (%d)",(ulong)(uint)(pIVar15->Tables).AliveCount);
    if (bVar17) {
      if (0 < (pIVar15->Tables).Map.Data.Size) {
        lVar21 = 8;
        lVar23 = 0;
        do {
          pIVar25 = (pIVar15->Tables).Buf.Data;
          lVar30 = (long)*(int *)((long)&((pIVar15->Tables).Map.Data.Data)->key + lVar21);
          if (pIVar25 != (ImGuiTable *)0x0 && lVar30 != -1) {
            DebugNodeTable(pIVar25 + lVar30);
          }
          lVar23 = lVar23 + 1;
          lVar21 = lVar21 + 0x10;
        } while (lVar23 < (pIVar15->Tables).Map.Data.Size);
      }
      TreePop();
    }
    atlas = (pIVar15->IO).Fonts;
    bVar17 = TreeNode("Fonts","Fonts (%d)",(ulong)(uint)(atlas->Fonts).Size);
    if (bVar17) {
      ShowFontAtlas(atlas);
      TreePop();
    }
    bVar17 = TreeNode("Settings");
    if (bVar17) {
      bVar17 = SmallButton("Clear");
      if (bVar17) {
        ClearIniSettings();
      }
      pIVar16 = GImGui;
      pIVar7 = GImGui->CurrentWindow;
      pIVar7->WriteAccessed = true;
      if (pIVar7->SkipItems == false) {
        (pIVar7->DC).CursorPos.x = (pIVar16->Style).ItemSpacing.x + (pIVar7->DC).CursorPosPrevLine.x
        ;
        (pIVar7->DC).CursorPos.y = (pIVar7->DC).CursorPosPrevLine.y;
        (pIVar7->DC).CurrLineSize = (pIVar7->DC).PrevLineSize;
        (pIVar7->DC).CurrLineTextBaseOffset = (pIVar7->DC).PrevLineTextBaseOffset;
      }
      bVar17 = SmallButton("Save to memory");
      if (bVar17) {
        SaveIniSettingsToMemory((size_t *)0x0);
      }
      pIVar16 = GImGui;
      pIVar7 = GImGui->CurrentWindow;
      pIVar7->WriteAccessed = true;
      if (pIVar7->SkipItems == false) {
        (pIVar7->DC).CursorPos.x = (pIVar16->Style).ItemSpacing.x + (pIVar7->DC).CursorPosPrevLine.x
        ;
        (pIVar7->DC).CursorPos.y = (pIVar7->DC).CursorPosPrevLine.y;
        (pIVar7->DC).CurrLineSize = (pIVar7->DC).PrevLineSize;
        (pIVar7->DC).CurrLineTextBaseOffset = (pIVar7->DC).PrevLineTextBaseOffset;
      }
      bVar17 = SmallButton("Save to disk");
      if (bVar17) {
        SaveIniSettingsToDisk((pIVar15->IO).IniFilename);
      }
      pIVar16 = GImGui;
      pIVar7 = GImGui->CurrentWindow;
      pIVar7->WriteAccessed = true;
      if (pIVar7->SkipItems == false) {
        (pIVar7->DC).CursorPos.x = (pIVar16->Style).ItemSpacing.x + (pIVar7->DC).CursorPosPrevLine.x
        ;
        (pIVar7->DC).CursorPos.y = (pIVar7->DC).CursorPosPrevLine.y;
        (pIVar7->DC).CurrLineSize = (pIVar7->DC).PrevLineSize;
        (pIVar7->DC).CurrLineTextBaseOffset = (pIVar7->DC).PrevLineTextBaseOffset;
      }
      if ((pIVar15->IO).IniFilename == (char *)0x0) {
        TextUnformatted("<NULL>",(char *)0x0);
      }
      else {
        Text("\"%s\"");
      }
      Text("SettingsDirtyTimer %.2f",SUB84((double)pIVar15->SettingsDirtyTimer,0));
      bVar17 = TreeNode("SettingsHandlers","Settings handlers: (%d)",
                        (ulong)(uint)(pIVar15->SettingsHandlers).Size);
      if (bVar17) {
        if (0 < (pIVar15->SettingsHandlers).Size) {
          lVar21 = 0;
          lVar23 = 0;
          do {
            BulletText("%s",*(undefined8 *)
                             ((long)&((pIVar15->SettingsHandlers).Data)->TypeName + lVar21));
            lVar23 = lVar23 + 1;
            lVar21 = lVar21 + 0x48;
          } while (lVar23 < (pIVar15->SettingsHandlers).Size);
        }
        TreePop();
      }
      bVar17 = TreeNode("SettingsWindows","Settings packed data: Windows: %d bytes",
                        (ulong)(uint)(pIVar15->SettingsWindows).Buf.Size);
      if (bVar17) {
        pcVar24 = (pIVar15->SettingsWindows).Buf.Data;
        if (pcVar24 != (char *)0x0) {
          puVar36 = (uint *)(pcVar24 + 4);
          do {
            Text("0x%08X \"%s\" Pos (%d,%d) Size (%d,%d) Collapsed=%d",(ulong)*puVar36,puVar36 + 4,
                 (ulong)(uint)(int)(short)puVar36[1],(ulong)(uint)(int)*(short *)((long)puVar36 + 6)
                 ,(ulong)(uint)(int)(short)puVar36[2],
                 (ulong)(uint)(int)*(short *)((long)puVar36 + 10),(ulong)(byte)puVar36[3]);
            puVar36 = (uint *)((long)(int)puVar36[-1] + (long)puVar36);
          } while (puVar36 !=
                   (uint *)((pIVar15->SettingsWindows).Buf.Data +
                           (long)(pIVar15->SettingsWindows).Buf.Size + 4));
        }
        TreePop();
      }
      bVar17 = TreeNode("SettingsTables","Settings packed data: Tables: %d bytes",
                        (ulong)(uint)(pIVar15->SettingsTables).Buf.Size);
      if (bVar17) {
        pcVar24 = (pIVar15->SettingsTables).Buf.Data;
        if (pcVar24 != (char *)0x0) {
          settings = (ImGuiTableSettings *)(pcVar24 + 4);
          do {
            DebugNodeTableSettings(settings);
            iVar26._0_1_ = settings[-1].ColumnsCount;
            iVar26._1_1_ = settings[-1].ColumnsCountMax;
            iVar26._2_1_ = settings[-1].WantApply;
            iVar26._3_1_ = settings[-1].field_0xf;
            settings = (ImGuiTableSettings *)((long)&settings->ID + (long)iVar26);
          } while (settings !=
                   (ImGuiTableSettings *)
                   ((pIVar15->SettingsTables).Buf.Data +
                   (long)(pIVar15->SettingsTables).Buf.Size + 4));
        }
        TreePop();
      }
      iVar26 = (pIVar15->SettingsIniData).Buf.Size;
      uVar31 = (ulong)(iVar26 - 1);
      if (iVar26 == 0) {
        uVar31 = 0;
      }
      bVar17 = TreeNode("SettingsIniData","Settings unpacked data (.ini): %d bytes",uVar31);
      if (bVar17) {
        pcVar24 = (pIVar15->SettingsIniData).Buf.Data;
        pcVar22 = ImGuiTextBuffer::EmptyString;
        if (pcVar24 != (char *)0x0) {
          pcVar22 = pcVar24;
        }
        buf._4_4_ = GImGui->FontSize * 20.0;
        buf[0] = '\0';
        buf[1] = '\0';
        buf[2] = -0x80;
        buf[3] = -0x80;
        InputTextMultiline("##Ini",pcVar22,(long)(pIVar15->SettingsIniData).Buf.Size,(ImVec2 *)buf,
                           0x4000,(ImGuiInputTextCallback)0x0,(void *)0x0);
        TreePop();
      }
      TreePop();
    }
    bVar17 = TreeNode("Internal state");
    if (bVar17) {
      Text("WINDOWING");
      pIVar16 = GImGui;
      pIVar7 = GImGui->CurrentWindow;
      pIVar7->WriteAccessed = true;
      fVar38 = (pIVar16->Style).IndentSpacing + (pIVar7->DC).Indent.x;
      (pIVar7->DC).Indent.x = fVar38;
      (pIVar7->DC).CursorPos.x = fVar38 + (pIVar7->Pos).x + (pIVar7->DC).ColumnsOffset.x;
      pcVar22 = "NULL";
      pcVar24 = "NULL";
      if (pIVar15->HoveredWindow != (ImGuiWindow *)0x0) {
        pcVar24 = pIVar15->HoveredWindow->Name;
      }
      Text("HoveredWindow: \'%s\'",pcVar24);
      pcVar24 = "NULL";
      if (pIVar15->HoveredWindow != (ImGuiWindow *)0x0) {
        pcVar24 = pIVar15->HoveredWindow->RootWindow->Name;
      }
      Text("HoveredWindow->Root: \'%s\'",pcVar24);
      pcVar24 = "NULL";
      if (pIVar15->HoveredWindowUnderMovingWindow != (ImGuiWindow *)0x0) {
        pcVar24 = pIVar15->HoveredWindowUnderMovingWindow->Name;
      }
      Text("HoveredWindowUnderMovingWindow: \'%s\'",pcVar24);
      pcVar24 = "NULL";
      if (pIVar15->MovingWindow != (ImGuiWindow *)0x0) {
        pcVar24 = pIVar15->MovingWindow->Name;
      }
      iVar26 = 0;
      Text("MovingWindow: \'%s\'",pcVar24);
      pIVar16 = GImGui;
      pIVar7 = GImGui->CurrentWindow;
      pIVar7->WriteAccessed = true;
      fVar38 = (pIVar7->DC).Indent.x - (pIVar16->Style).IndentSpacing;
      (pIVar7->DC).Indent.x = fVar38;
      (pIVar7->DC).CursorPos.x = fVar38 + (pIVar7->Pos).x + (pIVar7->DC).ColumnsOffset.x;
      Text("ITEMS");
      pIVar16 = GImGui;
      pIVar7 = GImGui->CurrentWindow;
      pIVar7->WriteAccessed = true;
      fVar38 = (pIVar16->Style).IndentSpacing + (pIVar7->DC).Indent.x;
      (pIVar7->DC).Indent.x = fVar38;
      (pIVar7->DC).CursorPos.x = fVar38 + (pIVar7->Pos).x + (pIVar7->DC).ColumnsOffset.x;
      Text("ActiveId: 0x%08X/0x%08X (%.2f sec), AllowOverlap: %d, Source: %s",
           SUB84((double)pIVar15->ActiveIdTimer,0),(ulong)pIVar15->ActiveId,
           (ulong)pIVar15->ActiveIdPreviousFrame,(ulong)pIVar15->ActiveIdAllowOverlap,
           *(undefined8 *)(&DAT_001a8310 + (ulong)pIVar15->ActiveIdSource * 8));
      if (pIVar15->ActiveIdWindow != (ImGuiWindow *)0x0) {
        pcVar22 = pIVar15->ActiveIdWindow->Name;
      }
      Text("ActiveIdWindow: \'%s\'",pcVar22);
      uVar31 = 0;
      do {
        uVar31 = (ulong)((int)uVar31 +
                        (uint)(((pIVar15->ActiveIdUsingKeyInputMask).Storage[iVar26 >> 5] >>
                                (iVar26 + 0x200U & 0x1f) & 1) != 0));
        iVar26 = iVar26 + 1;
      } while (iVar26 != 0x85);
      Text("ActiveIdUsing: Wheel: %d, NavDirMask: %X, NavInputMask: %X, KeyInputMask: %d key(s)",
           (ulong)pIVar15->ActiveIdUsingMouseWheel,(ulong)pIVar15->ActiveIdUsingNavDirMask,
           (ulong)pIVar15->ActiveIdUsingNavInputMask,uVar31);
      Text("HoveredId: 0x%08X (%.2f sec), AllowOverlap: %d",SUB84((double)pIVar15->HoveredIdTimer,0)
           ,(ulong)pIVar15->HoveredIdPreviousFrame,(ulong)pIVar15->HoveredIdAllowOverlap);
      Text("DragDrop: %d, SourceId = 0x%08X, Payload \"%s\" (%d bytes)",
           (ulong)pIVar15->DragDropActive,(ulong)(pIVar15->DragDropPayload).SourceId,
           (pIVar15->DragDropPayload).DataType,(ulong)(uint)(pIVar15->DragDropPayload).DataSize);
      pIVar16 = GImGui;
      pIVar7 = GImGui->CurrentWindow;
      pIVar7->WriteAccessed = true;
      fVar38 = (pIVar7->DC).Indent.x - (pIVar16->Style).IndentSpacing;
      (pIVar7->DC).Indent.x = fVar38;
      (pIVar7->DC).CursorPos.x = fVar38 + (pIVar7->Pos).x + (pIVar7->DC).ColumnsOffset.x;
      Text("NAV,FOCUS");
      pIVar16 = GImGui;
      pIVar7 = GImGui->CurrentWindow;
      pIVar7->WriteAccessed = true;
      fVar38 = (pIVar16->Style).IndentSpacing + (pIVar7->DC).Indent.x;
      (pIVar7->DC).Indent.x = fVar38;
      (pIVar7->DC).CursorPos.x = fVar38 + (pIVar7->Pos).x + (pIVar7->DC).ColumnsOffset.x;
      pcVar22 = "NULL";
      pcVar24 = "NULL";
      if (pIVar15->NavWindow != (ImGuiWindow *)0x0) {
        pcVar24 = pIVar15->NavWindow->Name;
      }
      Text("NavWindow: \'%s\'",pcVar24);
      Text("NavId: 0x%08X, NavLayer: %d",(ulong)pIVar15->NavId,(ulong)pIVar15->NavLayer);
      Text("NavInputSource: %s",*(undefined8 *)(&DAT_001a8310 + (ulong)pIVar15->NavInputSource * 8))
      ;
      Text("NavActive: %d, NavVisible: %d",(ulong)(pIVar15->IO).NavActive,
           (ulong)(pIVar15->IO).NavVisible);
      Text("NavActivateId/DownId/PressedId/InputId: %08X/%08X/%08X/%08X",
           (ulong)pIVar15->NavActivateId,(ulong)pIVar15->NavActivateDownId,
           (ulong)pIVar15->NavActivatePressedId);
      Text("NavActivateFlags: %04X",(ulong)(uint)pIVar15->NavActivateFlags);
      Text("NavDisableHighlight: %d, NavDisableMouseHover: %d",(ulong)pIVar15->NavDisableHighlight,
           (ulong)pIVar15->NavDisableMouseHover);
      Text("NavFocusScopeId = 0x%08X",(ulong)pIVar15->NavFocusScopeId);
      if (pIVar15->NavWindowingTarget != (ImGuiWindow *)0x0) {
        pcVar22 = pIVar15->NavWindowingTarget->Name;
      }
      Text("NavWindowingTarget: \'%s\'",pcVar22);
      pIVar16 = GImGui;
      pIVar7 = GImGui->CurrentWindow;
      pIVar7->WriteAccessed = true;
      fVar38 = (pIVar7->DC).Indent.x - (pIVar16->Style).IndentSpacing;
      (pIVar7->DC).Indent.x = fVar38;
      (pIVar7->DC).CursorPos.x = fVar38 + (pIVar7->Pos).x + (pIVar7->DC).ColumnsOffset.x;
      TreePop();
    }
    if ((((pIVar15->DebugMetricsConfig).ShowWindowsRects != false) ||
        ((pIVar15->DebugMetricsConfig).ShowWindowsBeginOrder == true)) &&
       (0 < *(int *)local_1a8._0_8_)) {
      lVar21 = 0;
      do {
        pIVar7 = (pIVar15->Windows).Data[lVar21];
        if (pIVar7->WasActive == true) {
          pIVar18 = GetViewportDrawList(*(GImGui->Viewports).Data,1,"##Foreground");
          if ((pIVar15->DebugMetricsConfig).ShowWindowsRects == true) {
            buf._0_16_ = (undefined1  [16])
                         ShowMetricsWindow::Funcs::GetWindowRect(pIVar7,*local_198);
            ImDrawList::AddRect(pIVar18,(ImVec2 *)buf,(ImVec2 *)(buf + 8),0xff8000ff,0.0,0,1.0);
          }
          if (((pIVar15->DebugMetricsConfig).ShowWindowsBeginOrder == true) &&
             ((pIVar7->Flags & 0x1000000) == 0)) {
            ImFormatString(buf,0x20,"%d",(ulong)(uint)(int)pIVar7->BeginOrderWithinContext);
            local_1b8.y = GImGui->FontSize + (pIVar7->Pos).y;
            local_1b8.x = GImGui->FontSize + (pIVar7->Pos).x;
            ImDrawList::AddRectFilled(pIVar18,&pIVar7->Pos,&local_1b8,0xff6464c8,0.0,0);
            ImDrawList::AddText(pIVar18,&pIVar7->Pos,0xffffffff,buf,(char *)0x0);
          }
        }
        lVar21 = lVar21 + 1;
      } while (lVar21 < *(int *)local_1a8._0_8_);
    }
    if (((pIVar15->DebugMetricsConfig).ShowTablesRects == true) &&
       (0 < (pIVar15->Tables).Map.Data.Size)) {
      lVar21 = 0;
      do {
        pIVar25 = (pIVar15->Tables).Buf.Data;
        lVar23 = (long)(pIVar15->Tables).Map.Data.Data[lVar21].field_1.val_i;
        if ((pIVar25 != (ImGuiTable *)0x0 && lVar23 != -1) &&
           (pIVar25 = pIVar25 + lVar23, pIVar15->FrameCount + -1 <= pIVar25->LastFrameActive)) {
          pIVar18 = GetViewportDrawList(*(GImGui->Viewports).Data,1,"##Foreground");
          if (*local_1b0 < 6) {
            buf._0_16_ = (undefined1  [16])
                         ShowMetricsWindow::Funcs::GetTableRect(pIVar25,*local_1b0,-1);
            ImDrawList::AddRect(pIVar18,(ImVec2 *)buf,(ImVec2 *)(buf + 8),0xff8000ff,0.0,0,1.0);
          }
          else if (0 < pIVar25->ColumnsCount) {
            iVar26 = 0;
            do {
              buf._0_16_ = (undefined1  [16])
                           ShowMetricsWindow::Funcs::GetTableRect(pIVar25,*local_1b0,iVar26);
              bVar17 = iVar26 == pIVar25->HoveredColumnBody;
              col = 0xff8000ff;
              if (bVar17) {
                col = 0xff80ffff;
              }
              ImDrawList::AddRect(pIVar18,(ImVec2 *)buf,(ImVec2 *)(buf + 8),col,0.0,0,
                                  *(float *)(&DAT_0017c0d8 + (ulong)bVar17 * 4));
              iVar26 = iVar26 + 1;
            } while (iVar26 < pIVar25->ColumnsCount);
          }
        }
        lVar21 = lVar21 + 1;
      } while (lVar21 < (pIVar15->Tables).Map.Data.Size);
    }
    End();
    return;
  }
  End();
  return;
}

Assistant:

void ImGui::ShowMetricsWindow(bool* p_open)
{
    ImGuiContext& g = *GImGui;
    ImGuiIO& io = g.IO;
    ImGuiMetricsConfig* cfg = &g.DebugMetricsConfig;
    if (cfg->ShowStackTool)
        ShowStackToolWindow(&cfg->ShowStackTool);

    if (!Begin("Dear ImGui Metrics/Debugger", p_open) || GetCurrentWindow()->BeginCount > 1)
    {
        End();
        return;
    }

    // Basic info
    Text("Dear ImGui %s", GetVersion());
    Text("Application average %.3f ms/frame (%.1f FPS)", 1000.0f / io.Framerate, io.Framerate);
    Text("%d vertices, %d indices (%d triangles)", io.MetricsRenderVertices, io.MetricsRenderIndices, io.MetricsRenderIndices / 3);
    Text("%d visible windows, %d active allocations", io.MetricsRenderWindows, io.MetricsActiveAllocations);
    //SameLine(); if (SmallButton("GC")) { g.GcCompactAll = true; }

    Separator();

    // Debugging enums
    enum { WRT_OuterRect, WRT_OuterRectClipped, WRT_InnerRect, WRT_InnerClipRect, WRT_WorkRect, WRT_Content, WRT_ContentIdeal, WRT_ContentRegionRect, WRT_Count }; // Windows Rect Type
    const char* wrt_rects_names[WRT_Count] = { "OuterRect", "OuterRectClipped", "InnerRect", "InnerClipRect", "WorkRect", "Content", "ContentIdeal", "ContentRegionRect" };
    enum { TRT_OuterRect, TRT_InnerRect, TRT_WorkRect, TRT_HostClipRect, TRT_InnerClipRect, TRT_BackgroundClipRect, TRT_ColumnsRect, TRT_ColumnsWorkRect, TRT_ColumnsClipRect, TRT_ColumnsContentHeadersUsed, TRT_ColumnsContentHeadersIdeal, TRT_ColumnsContentFrozen, TRT_ColumnsContentUnfrozen, TRT_Count }; // Tables Rect Type
    const char* trt_rects_names[TRT_Count] = { "OuterRect", "InnerRect", "WorkRect", "HostClipRect", "InnerClipRect", "BackgroundClipRect", "ColumnsRect", "ColumnsWorkRect", "ColumnsClipRect", "ColumnsContentHeadersUsed", "ColumnsContentHeadersIdeal", "ColumnsContentFrozen", "ColumnsContentUnfrozen" };
    if (cfg->ShowWindowsRectsType < 0)
        cfg->ShowWindowsRectsType = WRT_WorkRect;
    if (cfg->ShowTablesRectsType < 0)
        cfg->ShowTablesRectsType = TRT_WorkRect;

    struct Funcs
    {
        static ImRect GetTableRect(ImGuiTable* table, int rect_type, int n)
        {
            if (rect_type == TRT_OuterRect)                     { return table->OuterRect; }
            else if (rect_type == TRT_InnerRect)                { return table->InnerRect; }
            else if (rect_type == TRT_WorkRect)                 { return table->WorkRect; }
            else if (rect_type == TRT_HostClipRect)             { return table->HostClipRect; }
            else if (rect_type == TRT_InnerClipRect)            { return table->InnerClipRect; }
            else if (rect_type == TRT_BackgroundClipRect)       { return table->BgClipRect; }
            else if (rect_type == TRT_ColumnsRect)              { ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->MinX, table->InnerClipRect.Min.y, c->MaxX, table->InnerClipRect.Min.y + table->LastOuterHeight); }
            else if (rect_type == TRT_ColumnsWorkRect)          { ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->WorkMinX, table->WorkRect.Min.y, c->WorkMaxX, table->WorkRect.Max.y); }
            else if (rect_type == TRT_ColumnsClipRect)          { ImGuiTableColumn* c = &table->Columns[n]; return c->ClipRect; }
            else if (rect_type == TRT_ColumnsContentHeadersUsed){ ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->WorkMinX, table->InnerClipRect.Min.y, c->ContentMaxXHeadersUsed, table->InnerClipRect.Min.y + table->LastFirstRowHeight); } // Note: y1/y2 not always accurate
            else if (rect_type == TRT_ColumnsContentHeadersIdeal){ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->WorkMinX, table->InnerClipRect.Min.y, c->ContentMaxXHeadersIdeal, table->InnerClipRect.Min.y + table->LastFirstRowHeight); }
            else if (rect_type == TRT_ColumnsContentFrozen)     { ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->WorkMinX, table->InnerClipRect.Min.y, c->ContentMaxXFrozen, table->InnerClipRect.Min.y + table->LastFirstRowHeight); }
            else if (rect_type == TRT_ColumnsContentUnfrozen)   { ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->WorkMinX, table->InnerClipRect.Min.y + table->LastFirstRowHeight, c->ContentMaxXUnfrozen, table->InnerClipRect.Max.y); }
            IM_ASSERT(0);
            return ImRect();
        }

        static ImRect GetWindowRect(ImGuiWindow* window, int rect_type)
        {
            if (rect_type == WRT_OuterRect)                 { return window->Rect(); }
            else if (rect_type == WRT_OuterRectClipped)     { return window->OuterRectClipped; }
            else if (rect_type == WRT_InnerRect)            { return window->InnerRect; }
            else if (rect_type == WRT_InnerClipRect)        { return window->InnerClipRect; }
            else if (rect_type == WRT_WorkRect)             { return window->WorkRect; }
            else if (rect_type == WRT_Content)       { ImVec2 min = window->InnerRect.Min - window->Scroll + window->WindowPadding; return ImRect(min, min + window->ContentSize); }
            else if (rect_type == WRT_ContentIdeal)         { ImVec2 min = window->InnerRect.Min - window->Scroll + window->WindowPadding; return ImRect(min, min + window->ContentSizeIdeal); }
            else if (rect_type == WRT_ContentRegionRect)    { return window->ContentRegionRect; }
            IM_ASSERT(0);
            return ImRect();
        }
    };

    // Tools
    if (TreeNode("Tools"))
    {
        // Stack Tool is your best friend!
        Checkbox("Show stack tool", &cfg->ShowStackTool);
        SameLine();
        MetricsHelpMarker("You can also call ImGui::ShowStackToolWindow() from your code.");

        Checkbox("Show windows begin order", &cfg->ShowWindowsBeginOrder);
        Checkbox("Show windows rectangles", &cfg->ShowWindowsRects);
        SameLine();
        SetNextItemWidth(GetFontSize() * 12);
        cfg->ShowWindowsRects |= Combo("##show_windows_rect_type", &cfg->ShowWindowsRectsType, wrt_rects_names, WRT_Count, WRT_Count);
        if (cfg->ShowWindowsRects && g.NavWindow != NULL)
        {
            BulletText("'%s':", g.NavWindow->Name);
            Indent();
            for (int rect_n = 0; rect_n < WRT_Count; rect_n++)
            {
                ImRect r = Funcs::GetWindowRect(g.NavWindow, rect_n);
                Text("(%6.1f,%6.1f) (%6.1f,%6.1f) Size (%6.1f,%6.1f) %s", r.Min.x, r.Min.y, r.Max.x, r.Max.y, r.GetWidth(), r.GetHeight(), wrt_rects_names[rect_n]);
            }
            Unindent();
        }

        Checkbox("Show tables rectangles", &cfg->ShowTablesRects);
        SameLine();
        SetNextItemWidth(GetFontSize() * 12);
        cfg->ShowTablesRects |= Combo("##show_table_rects_type", &cfg->ShowTablesRectsType, trt_rects_names, TRT_Count, TRT_Count);
        if (cfg->ShowTablesRects && g.NavWindow != NULL)
        {
            for (int table_n = 0; table_n < g.Tables.GetMapSize(); table_n++)
            {
                ImGuiTable* table = g.Tables.TryGetMapData(table_n);
                if (table == NULL || table->LastFrameActive < g.FrameCount - 1 || (table->OuterWindow != g.NavWindow && table->InnerWindow != g.NavWindow))
                    continue;

                BulletText("Table 0x%08X (%d columns, in '%s')", table->ID, table->ColumnsCount, table->OuterWindow->Name);
                if (IsItemHovered())
                    GetForegroundDrawList()->AddRect(table->OuterRect.Min - ImVec2(1, 1), table->OuterRect.Max + ImVec2(1, 1), IM_COL32(255, 255, 0, 255), 0.0f, 0, 2.0f);
                Indent();
                char buf[128];
                for (int rect_n = 0; rect_n < TRT_Count; rect_n++)
                {
                    if (rect_n >= TRT_ColumnsRect)
                    {
                        if (rect_n != TRT_ColumnsRect && rect_n != TRT_ColumnsClipRect)
                            continue;
                        for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
                        {
                            ImRect r = Funcs::GetTableRect(table, rect_n, column_n);
                            ImFormatString(buf, IM_ARRAYSIZE(buf), "(%6.1f,%6.1f) (%6.1f,%6.1f) Size (%6.1f,%6.1f) Col %d %s", r.Min.x, r.Min.y, r.Max.x, r.Max.y, r.GetWidth(), r.GetHeight(), column_n, trt_rects_names[rect_n]);
                            Selectable(buf);
                            if (IsItemHovered())
                                GetForegroundDrawList()->AddRect(r.Min - ImVec2(1, 1), r.Max + ImVec2(1, 1), IM_COL32(255, 255, 0, 255), 0.0f, 0, 2.0f);
                        }
                    }
                    else
                    {
                        ImRect r = Funcs::GetTableRect(table, rect_n, -1);
                        ImFormatString(buf, IM_ARRAYSIZE(buf), "(%6.1f,%6.1f) (%6.1f,%6.1f) Size (%6.1f,%6.1f) %s", r.Min.x, r.Min.y, r.Max.x, r.Max.y, r.GetWidth(), r.GetHeight(), trt_rects_names[rect_n]);
                        Selectable(buf);
                        if (IsItemHovered())
                            GetForegroundDrawList()->AddRect(r.Min - ImVec2(1, 1), r.Max + ImVec2(1, 1), IM_COL32(255, 255, 0, 255), 0.0f, 0, 2.0f);
                    }
                }
                Unindent();
            }
        }

        // The Item Picker tool is super useful to visually select an item and break into the call-stack of where it was submitted.
        if (Button("Item Picker.."))
            DebugStartItemPicker();
        SameLine();
        MetricsHelpMarker("Will call the IM_DEBUG_BREAK() macro to break in debugger.\nWarning: If you don't have a debugger attached, this will probably crash.");

        TreePop();
    }

    // Windows
    if (TreeNode("Windows", "Windows (%d)", g.Windows.Size))
    {
        //SetNextItemOpen(true, ImGuiCond_Once);
        DebugNodeWindowsList(&g.Windows, "By display order");
        DebugNodeWindowsList(&g.WindowsFocusOrder, "By focus order (root windows)");
        if (TreeNode("By submission order (begin stack)"))
        {
            // Here we display windows in their submitted order/hierarchy, however note that the Begin stack doesn't constitute a Parent<>Child relationship!
            ImVector<ImGuiWindow*>& temp_buffer = g.WindowsTempSortBuffer;
            temp_buffer.resize(0);
            for (int i = 0; i < g.Windows.Size; i++)
                if (g.Windows[i]->LastFrameActive + 1 >= g.FrameCount)
                    temp_buffer.push_back(g.Windows[i]);
            struct Func { static int IMGUI_CDECL WindowComparerByBeginOrder(const void* lhs, const void* rhs) { return ((int)(*(const ImGuiWindow* const *)lhs)->BeginOrderWithinContext - (*(const ImGuiWindow* const*)rhs)->BeginOrderWithinContext); } };
            ImQsort(temp_buffer.Data, (size_t)temp_buffer.Size, sizeof(ImGuiWindow*), Func::WindowComparerByBeginOrder);
            DebugNodeWindowsListByBeginStackParent(temp_buffer.Data, temp_buffer.Size, NULL);
            TreePop();
        }

        TreePop();
    }

    // DrawLists
    int drawlist_count = 0;
    for (int viewport_i = 0; viewport_i < g.Viewports.Size; viewport_i++)
        drawlist_count += g.Viewports[viewport_i]->DrawDataBuilder.GetDrawListCount();
    if (TreeNode("DrawLists", "DrawLists (%d)", drawlist_count))
    {
        Checkbox("Show ImDrawCmd mesh when hovering", &cfg->ShowDrawCmdMesh);
        Checkbox("Show ImDrawCmd bounding boxes when hovering", &cfg->ShowDrawCmdBoundingBoxes);
        for (int viewport_i = 0; viewport_i < g.Viewports.Size; viewport_i++)
        {
            ImGuiViewportP* viewport = g.Viewports[viewport_i];
            for (int layer_i = 0; layer_i < IM_ARRAYSIZE(viewport->DrawDataBuilder.Layers); layer_i++)
                for (int draw_list_i = 0; draw_list_i < viewport->DrawDataBuilder.Layers[layer_i].Size; draw_list_i++)
                    DebugNodeDrawList(NULL, viewport->DrawDataBuilder.Layers[layer_i][draw_list_i], "DrawList");
        }
        TreePop();
    }

    // Viewports
    if (TreeNode("Viewports", "Viewports (%d)", g.Viewports.Size))
    {
        Indent(GetTreeNodeToLabelSpacing());
        RenderViewportsThumbnails();
        Unindent(GetTreeNodeToLabelSpacing());
        for (int i = 0; i < g.Viewports.Size; i++)
            DebugNodeViewport(g.Viewports[i]);
        TreePop();
    }

    // Details for Popups
    if (TreeNode("Popups", "Popups (%d)", g.OpenPopupStack.Size))
    {
        for (int i = 0; i < g.OpenPopupStack.Size; i++)
        {
            ImGuiWindow* window = g.OpenPopupStack[i].Window;
            BulletText("PopupID: %08x, Window: '%s'%s%s", g.OpenPopupStack[i].PopupId, window ? window->Name : "NULL", window && (window->Flags & ImGuiWindowFlags_ChildWindow) ? " ChildWindow" : "", window && (window->Flags & ImGuiWindowFlags_ChildMenu) ? " ChildMenu" : "");
        }
        TreePop();
    }

    // Details for TabBars
    if (TreeNode("TabBars", "Tab Bars (%d)", g.TabBars.GetAliveCount()))
    {
        for (int n = 0; n < g.TabBars.GetMapSize(); n++)
            if (ImGuiTabBar* tab_bar = g.TabBars.TryGetMapData(n))
            {
                PushID(tab_bar);
                DebugNodeTabBar(tab_bar, "TabBar");
                PopID();
            }
        TreePop();
    }

    // Details for Tables
    if (TreeNode("Tables", "Tables (%d)", g.Tables.GetAliveCount()))
    {
        for (int n = 0; n < g.Tables.GetMapSize(); n++)
            if (ImGuiTable* table = g.Tables.TryGetMapData(n))
                DebugNodeTable(table);
        TreePop();
    }

    // Details for Fonts
#ifndef IMGUI_DISABLE_DEMO_WINDOWS
    ImFontAtlas* atlas = g.IO.Fonts;
    if (TreeNode("Fonts", "Fonts (%d)", atlas->Fonts.Size))
    {
        ShowFontAtlas(atlas);
        TreePop();
    }
#endif

    // Details for Docking
#ifdef IMGUI_HAS_DOCK
    if (TreeNode("Docking"))
    {
        TreePop();
    }
#endif // #ifdef IMGUI_HAS_DOCK

    // Settings
    if (TreeNode("Settings"))
    {
        if (SmallButton("Clear"))
            ClearIniSettings();
        SameLine();
        if (SmallButton("Save to memory"))
            SaveIniSettingsToMemory();
        SameLine();
        if (SmallButton("Save to disk"))
            SaveIniSettingsToDisk(g.IO.IniFilename);
        SameLine();
        if (g.IO.IniFilename)
            Text("\"%s\"", g.IO.IniFilename);
        else
            TextUnformatted("<NULL>");
        Text("SettingsDirtyTimer %.2f", g.SettingsDirtyTimer);
        if (TreeNode("SettingsHandlers", "Settings handlers: (%d)", g.SettingsHandlers.Size))
        {
            for (int n = 0; n < g.SettingsHandlers.Size; n++)
                BulletText("%s", g.SettingsHandlers[n].TypeName);
            TreePop();
        }
        if (TreeNode("SettingsWindows", "Settings packed data: Windows: %d bytes", g.SettingsWindows.size()))
        {
            for (ImGuiWindowSettings* settings = g.SettingsWindows.begin(); settings != NULL; settings = g.SettingsWindows.next_chunk(settings))
                DebugNodeWindowSettings(settings);
            TreePop();
        }

        if (TreeNode("SettingsTables", "Settings packed data: Tables: %d bytes", g.SettingsTables.size()))
        {
            for (ImGuiTableSettings* settings = g.SettingsTables.begin(); settings != NULL; settings = g.SettingsTables.next_chunk(settings))
                DebugNodeTableSettings(settings);
            TreePop();
        }

#ifdef IMGUI_HAS_DOCK
#endif // #ifdef IMGUI_HAS_DOCK

        if (TreeNode("SettingsIniData", "Settings unpacked data (.ini): %d bytes", g.SettingsIniData.size()))
        {
            InputTextMultiline("##Ini", (char*)(void*)g.SettingsIniData.c_str(), g.SettingsIniData.Buf.Size, ImVec2(-FLT_MIN, GetTextLineHeight() * 20), ImGuiInputTextFlags_ReadOnly);
            TreePop();
        }
        TreePop();
    }

    // Misc Details
    if (TreeNode("Internal state"))
    {
        Text("WINDOWING");
        Indent();
        Text("HoveredWindow: '%s'", g.HoveredWindow ? g.HoveredWindow->Name : "NULL");
        Text("HoveredWindow->Root: '%s'", g.HoveredWindow ? g.HoveredWindow->RootWindow->Name : "NULL");
        Text("HoveredWindowUnderMovingWindow: '%s'", g.HoveredWindowUnderMovingWindow ? g.HoveredWindowUnderMovingWindow->Name : "NULL");
        Text("MovingWindow: '%s'", g.MovingWindow ? g.MovingWindow->Name : "NULL");
        Unindent();

        Text("ITEMS");
        Indent();
        Text("ActiveId: 0x%08X/0x%08X (%.2f sec), AllowOverlap: %d, Source: %s", g.ActiveId, g.ActiveIdPreviousFrame, g.ActiveIdTimer, g.ActiveIdAllowOverlap, GetInputSourceName(g.ActiveIdSource));
        Text("ActiveIdWindow: '%s'", g.ActiveIdWindow ? g.ActiveIdWindow->Name : "NULL");

        int active_id_using_key_input_count = 0;
        for (int n = ImGuiKey_NamedKey_BEGIN; n < ImGuiKey_NamedKey_END; n++)
            active_id_using_key_input_count += g.ActiveIdUsingKeyInputMask[n] ? 1 : 0;
        Text("ActiveIdUsing: Wheel: %d, NavDirMask: %X, NavInputMask: %X, KeyInputMask: %d key(s)", g.ActiveIdUsingMouseWheel, g.ActiveIdUsingNavDirMask, g.ActiveIdUsingNavInputMask, active_id_using_key_input_count);
        Text("HoveredId: 0x%08X (%.2f sec), AllowOverlap: %d", g.HoveredIdPreviousFrame, g.HoveredIdTimer, g.HoveredIdAllowOverlap); // Not displaying g.HoveredId as it is update mid-frame
        Text("DragDrop: %d, SourceId = 0x%08X, Payload \"%s\" (%d bytes)", g.DragDropActive, g.DragDropPayload.SourceId, g.DragDropPayload.DataType, g.DragDropPayload.DataSize);
        Unindent();

        Text("NAV,FOCUS");
        Indent();
        Text("NavWindow: '%s'", g.NavWindow ? g.NavWindow->Name : "NULL");
        Text("NavId: 0x%08X, NavLayer: %d", g.NavId, g.NavLayer);
        Text("NavInputSource: %s", GetInputSourceName(g.NavInputSource));
        Text("NavActive: %d, NavVisible: %d", g.IO.NavActive, g.IO.NavVisible);
        Text("NavActivateId/DownId/PressedId/InputId: %08X/%08X/%08X/%08X", g.NavActivateId, g.NavActivateDownId, g.NavActivatePressedId, g.NavActivateInputId);
        Text("NavActivateFlags: %04X", g.NavActivateFlags);
        Text("NavDisableHighlight: %d, NavDisableMouseHover: %d", g.NavDisableHighlight, g.NavDisableMouseHover);
        Text("NavFocusScopeId = 0x%08X", g.NavFocusScopeId);
        Text("NavWindowingTarget: '%s'", g.NavWindowingTarget ? g.NavWindowingTarget->Name : "NULL");
        Unindent();

        TreePop();
    }

    // Overlay: Display windows Rectangles and Begin Order
    if (cfg->ShowWindowsRects || cfg->ShowWindowsBeginOrder)
    {
        for (int n = 0; n < g.Windows.Size; n++)
        {
            ImGuiWindow* window = g.Windows[n];
            if (!window->WasActive)
                continue;
            ImDrawList* draw_list = GetForegroundDrawList(window);
            if (cfg->ShowWindowsRects)
            {
                ImRect r = Funcs::GetWindowRect(window, cfg->ShowWindowsRectsType);
                draw_list->AddRect(r.Min, r.Max, IM_COL32(255, 0, 128, 255));
            }
            if (cfg->ShowWindowsBeginOrder && !(window->Flags & ImGuiWindowFlags_ChildWindow))
            {
                char buf[32];
                ImFormatString(buf, IM_ARRAYSIZE(buf), "%d", window->BeginOrderWithinContext);
                float font_size = GetFontSize();
                draw_list->AddRectFilled(window->Pos, window->Pos + ImVec2(font_size, font_size), IM_COL32(200, 100, 100, 255));
                draw_list->AddText(window->Pos, IM_COL32(255, 255, 255, 255), buf);
            }
        }
    }

    // Overlay: Display Tables Rectangles
    if (cfg->ShowTablesRects)
    {
        for (int table_n = 0; table_n < g.Tables.GetMapSize(); table_n++)
        {
            ImGuiTable* table = g.Tables.TryGetMapData(table_n);
            if (table == NULL || table->LastFrameActive < g.FrameCount - 1)
                continue;
            ImDrawList* draw_list = GetForegroundDrawList(table->OuterWindow);
            if (cfg->ShowTablesRectsType >= TRT_ColumnsRect)
            {
                for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
                {
                    ImRect r = Funcs::GetTableRect(table, cfg->ShowTablesRectsType, column_n);
                    ImU32 col = (table->HoveredColumnBody == column_n) ? IM_COL32(255, 255, 128, 255) : IM_COL32(255, 0, 128, 255);
                    float thickness = (table->HoveredColumnBody == column_n) ? 3.0f : 1.0f;
                    draw_list->AddRect(r.Min, r.Max, col, 0.0f, 0, thickness);
                }
            }
            else
            {
                ImRect r = Funcs::GetTableRect(table, cfg->ShowTablesRectsType, -1);
                draw_list->AddRect(r.Min, r.Max, IM_COL32(255, 0, 128, 255));
            }
        }
    }

#ifdef IMGUI_HAS_DOCK
    // Overlay: Display Docking info
    if (show_docking_nodes && g.IO.KeyCtrl)
    {
    }
#endif // #ifdef IMGUI_HAS_DOCK

    End();
}